

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
* __thiscall
phmap::priv::
btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
::operator--(btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
             *this)

{
  btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  bVar1;
  uint uVar2;
  btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  *pbVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  *pbVar7;
  btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  *pbVar8;
  char *__function;
  size_type i;
  int iStack_10;
  
  pbVar8 = this->node;
  if (((ulong)pbVar8 & 7) != 0) {
LAB_001d07e3:
    __function = 
    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
    ;
LAB_001d07f8:
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0xf84,__function);
  }
  uVar2 = this->position;
  i = (size_type)uVar2;
  if (pbVar8[0xb] ==
      (btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
       )0x0) {
    if ((int)uVar2 < 0) {
LAB_001d0838:
      __assert_fail("position >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0x994,
                    "void phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>>, std::pair<const int, int> &, std::pair<const int, int> *>::decrement_slow() [Node = phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>>, Reference = std::pair<const int, int> &, Pointer = std::pair<const int, int> *]"
                   );
    }
    do {
      pbVar8 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
               ::child(pbVar8,i);
      this->node = pbVar8;
      if (((ulong)pbVar8 & 7) != 0) goto LAB_001d07e3;
      i = (size_type)(byte)pbVar8[10];
    } while (pbVar8[0xb] ==
             (btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
              )0x0);
    this->position = (byte)pbVar8[10] - 1;
  }
  else {
    this->position = uVar2 - 1;
    if ((int)uVar2 < 1) {
      if (pbVar8[0xb] ==
          (btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
           )0x0) goto LAB_001d0838;
      pbVar3 = this->node;
      uVar4 = *(undefined8 *)&this->position;
      do {
        bVar5 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                ::is_root(pbVar8);
        if (bVar5) {
          iVar6 = this->position;
          break;
        }
        pbVar8 = this->node;
        if (((ulong)pbVar8 & 7) != 0) {
          __function = 
          "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
          ;
          goto LAB_001d07f8;
        }
        pbVar7 = btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                 ::child(*(btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                           **)pbVar8,(ulong)(byte)pbVar8[8]);
        pbVar8 = this->node;
        if (pbVar7 != pbVar8) {
          __assert_fail("node->parent()->child(node->position()) == node",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0x98c,
                        "void phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>>, std::pair<const int, int> &, std::pair<const int, int> *>::decrement_slow() [Node = phmap::priv::btree_node<phmap::priv::map_params<int, int, phmap::priv::(anonymous namespace)::IntCompareToCmp, std::allocator<std::pair<const int, int>>, 256, false>>, Reference = std::pair<const int, int> &, Pointer = std::pair<const int, int> *]"
                       );
        }
        if (((ulong)pbVar7 & 7) != 0) goto LAB_001d07e3;
        bVar1 = pbVar8[8];
        iVar6 = (byte)bVar1 - 1;
        this->position = iVar6;
        pbVar8 = *(btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                   **)pbVar8;
        this->node = pbVar8;
      } while (bVar1 == (btree_node<phmap::priv::map_params<int,_int,_phmap::priv::(anonymous_namespace)::IntCompareToCmp,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                         )0x0);
      if (iVar6 < 0) {
        iStack_10 = (int)uVar4;
        this->position = iStack_10;
        this->node = pbVar3;
      }
    }
  }
  return this;
}

Assistant:

btree_iterator& operator--() {
            decrement();
            return *this;
        }